

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftpdir.c
# Opt level: O1

int main(int argc,char **argv)

{
  in_addr_t iVar1;
  uint uVar2;
  int __fd;
  int iVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  size_t sVar9;
  byte bVar10;
  long lVar11;
  byte bVar12;
  bool bVar13;
  LIBSSH2_SFTP_ATTRIBUTES attrs;
  sockaddr_in sin;
  char longentry [512];
  char mem [512];
  byte local_480 [8];
  undefined8 local_478;
  uint local_470;
  uint local_468;
  sockaddr local_448;
  char local_438 [512];
  char local_238 [520];
  
  iVar1 = 0x100007f;
  if (1 < argc) {
    iVar1 = inet_addr(argv[1]);
  }
  if (2 < argc) {
    username = argv[2];
  }
  if (3 < argc) {
    password = argv[3];
  }
  if (4 < argc) {
    sftppath = argv[4];
  }
  uVar2 = libssh2_init(0);
  if (uVar2 != 0) {
    fprintf(_stderr,"libssh2 initialization failed (%d)\n",(ulong)uVar2);
    return 1;
  }
  __fd = socket(2,1,0);
  if (__fd == -1) {
    main_cold_11();
  }
  else {
    local_448.sa_family = 2;
    local_448.sa_data[0] = '\0';
    local_448.sa_data[1] = '\x16';
    local_448.sa_data._2_4_ = iVar1;
    iVar3 = connect(__fd,&local_448,0x10);
    if (iVar3 == 0) {
      lVar4 = libssh2_session_init_ex(0,0,0,0);
      if (lVar4 != 0) {
        uVar2 = libssh2_session_handshake(lVar4,__fd);
        if (uVar2 != 0) {
          fprintf(_stderr,"Failure establishing SSH session: %d\n",(ulong)uVar2);
          goto LAB_0010155b;
        }
        lVar5 = libssh2_hostkey_hash(lVar4,2);
        fwrite("Fingerprint: ",0xd,1,_stderr);
        lVar11 = 0;
        do {
          fprintf(_stderr,"%02X ",(ulong)*(byte *)(lVar5 + lVar11));
          lVar11 = lVar11 + 1;
        } while (lVar11 != 0x14);
        fputc(10,_stderr);
        pcVar7 = username;
        sVar6 = strlen(username);
        pcVar7 = (char *)libssh2_userauth_list(lVar4,pcVar7,sVar6 & 0xffffffff);
        if (pcVar7 != (char *)0x0) {
          fprintf(_stderr,"Authentication methods: %s\n",pcVar7);
          pcVar8 = strstr(pcVar7,"password");
          bVar13 = pcVar8 != (char *)0x0;
          pcVar8 = strstr(pcVar7,"keyboard-interactive");
          bVar10 = bVar13 + 2;
          if (pcVar8 == (char *)0x0) {
            bVar10 = bVar13;
          }
          pcVar7 = strstr(pcVar7,"publickey");
          bVar12 = bVar10 + 4;
          if (pcVar7 == (char *)0x0) {
            bVar12 = bVar10;
          }
          if (5 < argc) {
            if (bVar13) {
              iVar3 = strcmp(argv[5],"-p");
              if (iVar3 == 0) {
                bVar12 = 0;
                bVar13 = true;
              }
            }
            if ((bVar12 & 2) != 0) {
              iVar3 = strcmp(argv[5],"-i");
              if (iVar3 == 0) {
                bVar12 = 2;
                bVar13 = false;
              }
            }
            if ((bVar12 & 4) != 0) {
              iVar3 = strcmp(argv[5],"-k");
              if (iVar3 == 0) {
                bVar12 = 4;
                bVar13 = false;
              }
            }
          }
          pcVar7 = username;
          if (bVar13) {
            sVar6 = strlen(username);
            pcVar8 = password;
            sVar9 = strlen(password);
            iVar3 = libssh2_userauth_password_ex
                              (lVar4,pcVar7,sVar6 & 0xffffffff,pcVar8,sVar9 & 0xffffffff,0);
            if (iVar3 != 0) {
              main_cold_2();
              goto LAB_0010155b;
            }
          }
          else if ((bVar12 & 2) == 0) {
            if ((bVar12 & 4) == 0) {
              main_cold_7();
              goto LAB_0010155b;
            }
            sVar6 = strlen(username);
            iVar3 = libssh2_userauth_publickey_fromfile_ex
                              (lVar4,pcVar7,sVar6 & 0xffffffff,"/home/username/.ssh/id_rsa.pub",
                               "/home/username/.ssh/id_rsa",password);
            if (iVar3 != 0) {
              main_cold_5();
              goto LAB_0010155b;
            }
            main_cold_6();
          }
          else {
            sVar6 = strlen(username);
            iVar3 = libssh2_userauth_keyboard_interactive_ex
                              (lVar4,pcVar7,sVar6 & 0xffffffff,kbd_callback);
            if (iVar3 != 0) {
              main_cold_3();
              goto LAB_0010155b;
            }
            main_cold_4();
          }
        }
        fwrite("libssh2_sftp_init()!\n",0x15,1,_stderr);
        lVar5 = libssh2_sftp_init(lVar4);
        if (lVar5 == 0) {
          main_cold_9();
        }
        else {
          libssh2_session_set_blocking(lVar4,1);
          fwrite("libssh2_sftp_opendir()!\n",0x18,1,_stderr);
          pcVar7 = sftppath;
          sVar6 = strlen(sftppath);
          lVar11 = libssh2_sftp_open_ex(lVar5,pcVar7,sVar6 & 0xffffffff,0,0,1);
          if (lVar11 == 0) {
            main_cold_8();
          }
          else {
            fwrite("libssh2_sftp_opendir() is done, now receive listing!\n",0x35,1,_stderr);
            do {
              iVar3 = libssh2_sftp_readdir_ex(lVar11,local_238,0x200,local_438,0x200,local_480);
              if (iVar3 < 1) break;
              pcVar7 = local_438;
              if (local_438[0] == '\0') {
                pcVar7 = "--fix----- ";
                if ((local_480[0] & 4) == 0) {
                  pcVar7 = "---------- ";
                }
                printf(pcVar7);
                if ((local_480[0] & 2) == 0) {
                  printf("   -    - ");
                }
                else {
                  printf("%4d %4d ",(ulong)local_470,(ulong)local_468);
                }
                pcVar7 = local_238;
                if ((local_480[0] & 1) != 0) {
                  printf("%8llu ",local_478);
                }
              }
              puts(pcVar7);
            } while (0 < iVar3);
            libssh2_sftp_close_handle(lVar11);
            libssh2_sftp_shutdown(lVar5);
          }
        }
        goto LAB_0010155b;
      }
      main_cold_10();
    }
    else {
      main_cold_1();
    }
  }
  lVar4 = 0;
LAB_0010155b:
  if (lVar4 != 0) {
    libssh2_session_disconnect_ex(lVar4,0xb,"Normal Shutdown","");
    libssh2_session_free(lVar4);
  }
  if (__fd != -1) {
    shutdown(__fd,2);
    close(__fd);
  }
  fwrite("all done\n",9,1,_stderr);
  libssh2_exit();
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
    uint32_t hostaddr;
    libssh2_socket_t sock;
    int i, auth_pw = 0;
    struct sockaddr_in sin;
    const char *fingerprint;
    char *userauthlist;
    int rc;
    LIBSSH2_SESSION *session = NULL;
    LIBSSH2_SFTP *sftp_session;
    LIBSSH2_SFTP_HANDLE *sftp_handle;

#ifdef WIN32
    WSADATA wsadata;

    rc = WSAStartup(MAKEWORD(2, 0), &wsadata);
    if(rc) {
        fprintf(stderr, "WSAStartup failed with error: %d\n", rc);
        return 1;
    }
#endif

    if(argc > 1) {
        hostaddr = inet_addr(argv[1]);
    }
    else {
        hostaddr = htonl(0x7F000001);
    }
    if(argc > 2) {
        username = argv[2];
    }
    if(argc > 3) {
        password = argv[3];
    }
    if(argc > 4) {
        sftppath = argv[4];
    }

    rc = libssh2_init(0);
    if(rc) {
        fprintf(stderr, "libssh2 initialization failed (%d)\n", rc);
        return 1;
    }

    /*
     * The application code is responsible for creating the socket
     * and establishing the connection
     */
    sock = socket(AF_INET, SOCK_STREAM, 0);
    if(sock == LIBSSH2_INVALID_SOCKET) {
        fprintf(stderr, "failed to create socket!\n");
        goto shutdown;
    }

    sin.sin_family = AF_INET;
    sin.sin_port = htons(22);
    sin.sin_addr.s_addr = hostaddr;
    if(connect(sock, (struct sockaddr*)(&sin), sizeof(struct sockaddr_in))) {
        fprintf(stderr, "failed to connect!\n");
        goto shutdown;
    }

    /* Create a session instance */
    session = libssh2_session_init();
    if(!session) {
        fprintf(stderr, "Could not initialize SSH session!\n");
        goto shutdown;
    }

    /* ... start it up. This will trade welcome banners, exchange keys,
     * and setup crypto, compression, and MAC layers
     */
    rc = libssh2_session_handshake(session, sock);
    if(rc) {
        fprintf(stderr, "Failure establishing SSH session: %d\n", rc);
        goto shutdown;
    }

    /* At this point we have not yet authenticated.  The first thing to do
     * is check the hostkey's fingerprint against our known hosts Your app
     * may have it hard coded, may go to a file, may present it to the
     * user, that's your call
     */
    fingerprint = libssh2_hostkey_hash(session, LIBSSH2_HOSTKEY_HASH_SHA1);
    fprintf(stderr, "Fingerprint: ");
    for(i = 0; i < 20; i++) {
        fprintf(stderr, "%02X ", (unsigned char)fingerprint[i]);
    }
    fprintf(stderr, "\n");

    /* check what authentication methods are available */
    userauthlist = libssh2_userauth_list(session, username,
                                         (unsigned int)strlen(username));
    if(userauthlist) {
        fprintf(stderr, "Authentication methods: %s\n", userauthlist);
        if(strstr(userauthlist, "password")) {
            auth_pw |= 1;
        }
        if(strstr(userauthlist, "keyboard-interactive")) {
            auth_pw |= 2;
        }
        if(strstr(userauthlist, "publickey")) {
            auth_pw |= 4;
        }

        /* check for options */
        if(argc > 5) {
            if((auth_pw & 1) && !strcmp(argv[5], "-p")) {
                auth_pw = 1;
            }
            if((auth_pw & 2) && !strcmp(argv[5], "-i")) {
                auth_pw = 2;
            }
            if((auth_pw & 4) && !strcmp(argv[5], "-k")) {
                auth_pw = 4;
            }
        }

        if(auth_pw & 1) {
            /* We could authenticate via password */
            if(libssh2_userauth_password(session, username, password)) {
                fprintf(stderr, "Authentication by password failed!\n");
                goto shutdown;
            }
        }
        else if(auth_pw & 2) {
            /* Or via keyboard-interactive */
            if(libssh2_userauth_keyboard_interactive(session, username,
                                                     &kbd_callback) ) {
                fprintf(stderr,
                        "Authentication by keyboard-interactive failed!\n");
                goto shutdown;
            }
            else {
                fprintf(stderr,
                        "Authentication by keyboard-interactive succeeded.\n");
            }
        }
        else if(auth_pw & 4) {
            /* Or by public key */
            if(libssh2_userauth_publickey_fromfile(session, username,
                                                   pubkey, privkey,
                                                   password)) {
                fprintf(stderr, "Authentication by public key failed!\n");
                goto shutdown;
            }
            else {
                fprintf(stderr, "Authentication by public key succeeded.\n");
            }
        }
        else {
            fprintf(stderr, "No supported authentication methods found!\n");
            goto shutdown;
        }
    }

    fprintf(stderr, "libssh2_sftp_init()!\n");
    sftp_session = libssh2_sftp_init(session);

    if(!sftp_session) {
        fprintf(stderr, "Unable to init SFTP session\n");
        goto shutdown;
    }

    /* Since we have not set non-blocking, tell libssh2 we are blocking */
    libssh2_session_set_blocking(session, 1);

    fprintf(stderr, "libssh2_sftp_opendir()!\n");
    /* Request a dir listing via SFTP */
    sftp_handle = libssh2_sftp_opendir(sftp_session, sftppath);
    if(!sftp_handle) {
        fprintf(stderr, "Unable to open dir with SFTP\n");
        goto shutdown;
    }

    fprintf(stderr, "libssh2_sftp_opendir() is done, now receive listing!\n");
    do {
        char mem[512];
        char longentry[512];
        LIBSSH2_SFTP_ATTRIBUTES attrs;

        /* loop until we fail */
        rc = libssh2_sftp_readdir_ex(sftp_handle, mem, sizeof(mem),
                                     longentry, sizeof(longentry), &attrs);
        if(rc > 0) {
            /* rc is the length of the file name in the mem
               buffer */

            if(longentry[0] != '\0') {
                printf("%s\n", longentry);
            }
            else {
                if(attrs.flags & LIBSSH2_SFTP_ATTR_PERMISSIONS) {
                    /* this should check what permissions it
                       is and print the output accordingly */
                    printf("--fix----- ");
                }
                else {
                    printf("---------- ");
                }

                if(attrs.flags & LIBSSH2_SFTP_ATTR_UIDGID) {
                    printf("%4d %4d ", (int) attrs.uid, (int) attrs.gid);
                }
                else {
                    printf("   -    - ");
                }

                if(attrs.flags & LIBSSH2_SFTP_ATTR_SIZE) {
                    printf("%8" __FILESIZE " ", attrs.filesize);
                }

                printf("%s\n", mem);
            }
        }
        else {
            break;
        }

    } while(1);

    libssh2_sftp_closedir(sftp_handle);
    libssh2_sftp_shutdown(sftp_session);

shutdown:

    if(session) {
        libssh2_session_disconnect(session, "Normal Shutdown");
        libssh2_session_free(session);
    }

    if(sock != LIBSSH2_INVALID_SOCKET) {
        shutdown(sock, 2);
#ifdef WIN32
        closesocket(sock);
#else
        close(sock);
#endif
    }

    fprintf(stderr, "all done\n");

    libssh2_exit();

    return 0;
}